

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StructNew *curr)

{
  Struct *pSVar1;
  pointer pFVar2;
  Expression **childp;
  pointer pFVar3;
  size_t i;
  ulong index;
  long lVar4;
  HeapType local_38;
  
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != 0) {
    local_38 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                           super_Expression.type);
    pSVar1 = HeapType::getStruct(&local_38);
    pFVar3 = (pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pFVar2 - (long)pFVar3 >> 4 !=
        (curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                    ,0x371,
                    "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStructNew(StructNew *) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                   );
    }
    lVar4 = 0;
    for (index = 0; index < (ulong)((long)pFVar2 - (long)pFVar3 >> 4); index = index + 1) {
      childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                         (&(curr->operands).
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          ,index);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,childp,
                 (Type)*(uintptr_t *)
                        ((long)&(((pSVar1->fields).
                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->type).id + lVar4));
      pFVar3 = (pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x10;
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0; i < fields.size(); ++i) {
      note(&curr->operands[i], fields[i].type);
    }
  }